

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  pointer pcVar3;
  ostream *poVar4;
  TablePrinter *pTVar5;
  int in_EAX;
  int extraout_EAX;
  size_t sVar6;
  pointer pCVar7;
  long lVar8;
  Columns headerCols;
  Column spacer;
  Columns local_c8;
  TablePrinter *local_a8;
  value_type local_a0;
  Column local_68;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    if (0 < this->m_currentColumn) {
      local_68.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)&local_68,1);
      this->m_currentColumn = -1;
    }
    local_c8.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TextFlow::Spacer(&local_68,2);
    pCVar7 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = this;
    if (pCVar7 != pCVar2) {
      paVar1 = &local_a0.m_string.field_2;
      do {
        if (pCVar7->width < 3) {
          __assert_fail("info.width > 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                        ,0x2172,"void Catch::TablePrinter::open()");
        }
        pcVar3 = (pCVar7->name)._M_dataplus._M_p;
        local_a0.m_string._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (pCVar7->name)._M_string_length);
        local_a0.m_width = 0x4f;
        local_a0.m_indent = 0;
        local_a0.m_initialIndent = 0xffffffffffffffff;
        sVar6 = pCVar7->width - 2;
        if (sVar6 == 0) {
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                        ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
        }
        local_a0.m_width = sVar6;
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::push_back
                  (&local_c8.m_columns,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.m_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.m_string._M_dataplus._M_p,
                          local_a0.m_string.field_2._M_allocated_capacity + 1);
        }
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::push_back
                  (&local_c8.m_columns,&local_68);
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != pCVar2);
    }
    pTVar5 = local_a8;
    poVar4 = local_a8->m_os;
    TextFlow::operator<<(poVar4,&local_c8);
    local_a0.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_a0,1);
    poVar4 = pTVar5->m_os;
    lVar8 = 0x4f;
    do {
      std::ostream::put((char)poVar4);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    local_a0.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_a0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68.m_string._M_dataplus._M_p._1_7_,
                    local_68.m_string._M_dataplus._M_p._0_1_) != &local_68.m_string.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_68.m_string._M_dataplus._M_p._1_7_,
                               local_68.m_string._M_dataplus._M_p._0_1_),
                      local_68.m_string.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&local_c8.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			auto spacer = TextFlow::Spacer(2);
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }